

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
FastVector<x86Instruction,_true,_true>::grow
          (FastVector<x86Instruction,_true,_true> *this,uint newSize)

{
  x86Instruction *ptr;
  uint oldMax;
  x86Instruction *oldData;
  uint newSize_local;
  FastVector<x86Instruction,_true,_true> *this_local;
  
  ptr = this->data;
  grow_no_destroy(this,newSize);
  if (ptr != (x86Instruction *)0x0) {
    NULLC::alignedDealloc(ptr);
  }
  return;
}

Assistant:

void grow(unsigned newSize)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}